

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O1

void qt_blend_rgb32_on_rgb32_sse2
               (uchar *destPixels,int dbpl,uchar *srcPixels,int sbpl,int w,int h,int const_alpha)

{
  ushort *puVar1;
  ushort *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uchar *puVar13;
  short sVar14;
  short sVar16;
  undefined1 auVar15 [16];
  short sVar17;
  short sVar19;
  undefined1 auVar18 [16];
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  
  if (const_alpha != 0) {
    if (const_alpha == 0x100) {
      qt_blend_rgb32_on_rgb32(destPixels,dbpl,srcPixels,sbpl,w,h,0x100);
    }
    else if (0 < h) {
      uVar3 = const_alpha * 0xff >> 8;
      uVar11 = 0xff - uVar3;
      auVar15 = pshuflw(ZEXT416(uVar3),ZEXT416(uVar3),0);
      auVar18 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
      uVar12 = (ulong)w;
      iVar7 = 0;
      puVar13 = destPixels;
      do {
        uVar5 = (ulong)((byte)-((byte)(((ulong)puVar13 & 0xffffffff) >> 2) & 0x3f) & 3);
        if (uVar12 < uVar5) {
          uVar5 = uVar12;
        }
        uVar8 = (ulong)(-((uint)((ulong)destPixels >> 2) & 0x3fffffff) & 3);
        if (uVar12 <= uVar8) {
          uVar8 = uVar12;
        }
        uVar4 = 0;
        if (uVar8 != 0) {
          uVar4 = 0;
          do {
            uVar9 = (*(uint *)(destPixels + uVar4 * 4) & 0xff00ff) * uVar11 +
                    (*(uint *)(srcPixels + uVar4 * 4) & 0xff00ff) * uVar3;
            uVar6 = (*(uint *)(destPixels + uVar4 * 4) >> 8 & 0xff00ff) * uVar11 +
                    (*(uint *)(srcPixels + uVar4 * 4) >> 8 & 0xff00ff) * uVar3;
            *(uint *)(destPixels + uVar4 * 4) =
                 uVar6 + 0x800080 + (uVar6 >> 8 & 0xff00ff) & 0xff00ff00 |
                 uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
        if ((int)uVar4 < w + -3) {
          uVar4 = uVar4 & 0xffffffff;
          do {
            puVar1 = (ushort *)(srcPixels + uVar4 * 4);
            puVar2 = (ushort *)(destPixels + uVar4 * 4);
            sVar14 = auVar15._0_2_;
            sVar16 = auVar15._2_2_;
            sVar17 = auVar18._0_2_;
            sVar19 = auVar18._2_2_;
            uVar28 = (*puVar2 >> 8) * sVar17 + (*puVar1 >> 8) * sVar14;
            uVar29 = (puVar2[1] >> 8) * sVar19 + (puVar1[1] >> 8) * sVar16;
            uVar30 = (puVar2[2] >> 8) * sVar17 + (puVar1[2] >> 8) * sVar14;
            uVar31 = (puVar2[3] >> 8) * sVar19 + (puVar1[3] >> 8) * sVar16;
            uVar32 = (puVar2[4] >> 8) * sVar17 + (puVar1[4] >> 8) * sVar14;
            uVar33 = (puVar2[5] >> 8) * sVar19 + (puVar1[5] >> 8) * sVar16;
            uVar34 = (puVar2[6] >> 8) * sVar17 + (puVar1[6] >> 8) * sVar14;
            uVar35 = (puVar2[7] >> 8) * sVar19 + (puVar1[7] >> 8) * sVar16;
            uVar20 = (*puVar2 & 0xff) * sVar17 + (*puVar1 & 0xff) * sVar14;
            uVar21 = (puVar2[1] & 0xff) * sVar19 + (puVar1[1] & 0xff) * sVar16;
            uVar22 = (puVar2[2] & 0xff) * sVar17 + (puVar1[2] & 0xff) * sVar14;
            uVar23 = (puVar2[3] & 0xff) * sVar19 + (puVar1[3] & 0xff) * sVar16;
            uVar24 = (puVar2[4] & 0xff) * sVar17 + (puVar1[4] & 0xff) * sVar14;
            uVar25 = (puVar2[5] & 0xff) * sVar19 + (puVar1[5] & 0xff) * sVar16;
            uVar26 = (puVar2[6] & 0xff) * sVar17 + (puVar1[6] & 0xff) * sVar14;
            uVar27 = (puVar2[7] & 0xff) * sVar19 + (puVar1[7] & 0xff) * sVar16;
            puVar1 = (ushort *)(destPixels + uVar4 * 4);
            *puVar1 = (ushort)(uVar20 + 0x80 + (uVar20 >> 8)) >> 8 |
                      uVar28 + 0x80 + (uVar28 >> 8) & 0xff00;
            puVar1[1] = (ushort)(uVar21 + 0x80 + (uVar21 >> 8)) >> 8 |
                        uVar29 + 0x80 + (uVar29 >> 8) & 0xff00;
            puVar1[2] = (ushort)(uVar22 + 0x80 + (uVar22 >> 8)) >> 8 |
                        uVar30 + 0x80 + (uVar30 >> 8) & 0xff00;
            puVar1[3] = (ushort)(uVar23 + 0x80 + (uVar23 >> 8)) >> 8 |
                        uVar31 + 0x80 + (uVar31 >> 8) & 0xff00;
            puVar1[4] = (ushort)(uVar24 + 0x80 + (uVar24 >> 8)) >> 8 |
                        uVar32 + 0x80 + (uVar32 >> 8) & 0xff00;
            puVar1[5] = (ushort)(uVar25 + 0x80 + (uVar25 >> 8)) >> 8 |
                        uVar33 + 0x80 + (uVar33 >> 8) & 0xff00;
            puVar1[6] = (ushort)(uVar26 + 0x80 + (uVar26 >> 8)) >> 8 |
                        uVar34 + 0x80 + (uVar34 >> 8) & 0xff00;
            puVar1[7] = (ushort)(uVar27 + 0x80 + (uVar27 >> 8)) >> 8 |
                        uVar35 + 0x80 + (uVar35 >> 8) & 0xff00;
            uVar4 = uVar4 + 4;
          } while ((long)uVar4 < (long)(w + -3));
        }
        if ((int)uVar4 < w) {
          uVar4 = uVar4 & 0xffffffff;
          uVar6 = 0;
          do {
            uVar4 = uVar4 + 1;
            uVar10 = (*(uint *)(destPixels + uVar4 * 4 + -4) & 0xff00ff) * uVar11 +
                     (*(uint *)(srcPixels + uVar4 * 4 + -4) & 0xff00ff) * uVar3;
            uVar9 = (*(uint *)(destPixels + uVar4 * 4 + -4) >> 8 & 0xff00ff) * uVar11 +
                    (*(uint *)(srcPixels + uVar4 * 4 + -4) >> 8 & 0xff00ff) * uVar3;
            *(uint *)(destPixels + uVar4 * 4 + -4) =
                 uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) & 0xff00ff00 |
                 uVar10 + 0x800080 + (uVar10 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
            if (1 < uVar6) break;
            uVar6 = uVar6 + 1;
          } while ((long)uVar4 < (long)uVar12);
        }
        destPixels = destPixels + dbpl;
        srcPixels = srcPixels + sbpl;
        iVar7 = iVar7 + 1;
        puVar13 = puVar13 + dbpl;
      } while (iVar7 != h);
    }
  }
  return;
}

Assistant:

void qt_blend_rgb32_on_rgb32_sse2(uchar *destPixels, int dbpl,
                                 const uchar *srcPixels, int sbpl,
                                 int w, int h,
                                 int const_alpha)
{
    const quint32 *src = (const quint32 *) srcPixels;
    quint32 *dst = (quint32 *) destPixels;
    if (const_alpha != 256) {
        if (const_alpha != 0) {
            const __m128i half = _mm_set1_epi16(0x80);
            const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);

            const_alpha = (const_alpha * 255) >> 8;
            int one_minus_const_alpha = 255 - const_alpha;
            const __m128i constAlphaVector = _mm_set1_epi16(const_alpha);
            const __m128i oneMinusConstAlpha =  _mm_set1_epi16(one_minus_const_alpha);
            for (int y = 0; y < h; ++y) {
                int x = 0;

                // First, align dest to 16 bytes:
                ALIGNMENT_PROLOGUE_16BYTES(dst, x, w) {
                    dst[x] = INTERPOLATE_PIXEL_255(src[x], const_alpha, dst[x], one_minus_const_alpha);
                }

                for (; x < w-3; x += 4) {
                    __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[x]);
                    const __m128i dstVector = _mm_load_si128((__m128i *)&dst[x]);
                    __m128i result;
                    INTERPOLATE_PIXEL_255_SSE2(result, srcVector, dstVector, constAlphaVector, oneMinusConstAlpha, colorMask, half);
                    _mm_store_si128((__m128i *)&dst[x], result);
                }
                SIMD_EPILOGUE(x, w, 3)
                    dst[x] = INTERPOLATE_PIXEL_255(src[x], const_alpha, dst[x], one_minus_const_alpha);
                dst = (quint32 *)(((uchar *) dst) + dbpl);
                src = (const quint32 *)(((const uchar *) src) + sbpl);
            }
        }
    } else {
        qt_blend_rgb32_on_rgb32(destPixels, dbpl, srcPixels, sbpl, w, h, const_alpha);
    }
}